

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetPHINFPartNumber(ndicapi *pol,char *part)

{
  int local_24;
  char *pcStack_20;
  int i;
  char *dp;
  char *part_local;
  ndicapi *pol_local;
  
  pcStack_20 = pol->PhinfPartNumber;
  for (local_24 = 0; local_24 < 0x14; local_24 = local_24 + 1) {
    part[local_24] = *pcStack_20;
    pcStack_20 = pcStack_20 + 1;
  }
  return pol->PhinfUnoccupied;
}

Assistant:

ndicapiExport int ndiGetPHINFPartNumber(ndicapi* pol, char part[20])
{
  char* dp;
  int i;

  dp = pol->PhinfPartNumber;

  for (i = 0; i < 20; i++)
  {
    part[i] = *dp++;
  }

  return pol->PhinfUnoccupied;
}